

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O0

int TIFFReadRGBAImageOriented
              (TIFF *tif,uint32_t rwidth,uint32_t rheight,uint32_t *raster,int orientation,int stop)

{
  int iVar1;
  char *module;
  undefined1 local_4b8 [4];
  int ok;
  TIFFRGBAImage img;
  char emsg [1024];
  int stop_local;
  int orientation_local;
  uint32_t *raster_local;
  uint32_t rheight_local;
  uint32_t rwidth_local;
  TIFF *tif_local;
  
  memset(&img.row_offset,0,0x400);
  iVar1 = TIFFRGBAImageOK(tif,(char *)&img.row_offset);
  if ((iVar1 != 0) &&
     (iVar1 = TIFFRGBAImageBegin((TIFFRGBAImage *)local_4b8,tif,stop,(char *)&img.row_offset),
     iVar1 != 0)) {
    img.height._2_2_ = (undefined2)orientation;
    iVar1 = TIFFRGBAImageGet((TIFFRGBAImage *)local_4b8,raster + (rheight - img.alpha) * rwidth,
                             rwidth,img.alpha);
    TIFFRGBAImageEnd((TIFFRGBAImage *)local_4b8);
    return iVar1;
  }
  module = TIFFFileName(tif);
  TIFFErrorExtR(tif,module,"%s",&img.row_offset);
  return 0;
}

Assistant:

int TIFFReadRGBAImageOriented(TIFF *tif, uint32_t rwidth, uint32_t rheight,
                              uint32_t *raster, int orientation, int stop)
{
    char emsg[EMSG_BUF_SIZE] = "";
    TIFFRGBAImage img;
    int ok;

    if (TIFFRGBAImageOK(tif, emsg) && TIFFRGBAImageBegin(&img, tif, stop, emsg))
    {
        img.req_orientation = (uint16_t)orientation;
        /* XXX verify rwidth and rheight against width and height */
        ok = TIFFRGBAImageGet(&img, raster + (rheight - img.height) * rwidth,
                              rwidth, img.height);
        TIFFRGBAImageEnd(&img);
    }
    else
    {
        TIFFErrorExtR(tif, TIFFFileName(tif), "%s", emsg);
        ok = 0;
    }
    return (ok);
}